

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O3

bool __thiscall wasm::ExecutionResults::operator==(ExecutionResults *this,ExecutionResults *other)

{
  _Base_ptr __k;
  __index_type _Var1;
  pointer pLVar2;
  size_t sVar3;
  ExecutionResults *this_00;
  bool bVar4;
  iterator iVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  SmallVector<wasm::Literal,_1UL> *other_00;
  SmallVector<wasm::Literal,_1UL> *other_01;
  _Base_ptr p_Var8;
  char *in_RCX;
  ulong uVar9;
  long lVar10;
  pointer pLVar11;
  char *pcVar12;
  ulong uVar13;
  bool bVar14;
  Name name;
  Name name_00;
  Literal local_108;
  Literal local_f0;
  SmallVector<wasm::Literal,_1UL> local_d8;
  SmallVector<wasm::Literal,_1UL> local_a0;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  Literal *local_50;
  ExecutionResults *local_48;
  ExecutionResults *local_40;
  char local_31;
  
  if ((this->ignore == false) && (other->ignore != true)) {
    p_Var8 = (other->results)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_58 = &(other->results)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_40 = this;
    if (p_Var8 != local_58) {
      local_60 = &(this->results)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_50 = local_d8.fixed._M_elems;
      local_48 = other;
      do {
        this_00 = local_48;
        __k = p_Var8 + 1;
        iVar5 = std::
                _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                        *)this,(key_type *)__k);
        if (iVar5._M_node == local_60) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[fuzz-exec] missing ",0x14);
          name_00.super_IString.str._M_str = in_RCX;
          name_00.super_IString.str._M_len = (size_t)p_Var8[1]._M_parent;
          poVar6 = wasm::operator<<((wasm *)&std::cout,*(ostream **)(p_Var8 + 1),name_00);
          pcVar12 = &local_31;
          local_31 = '\n';
          lVar10 = 1;
          goto LAB_001cfe1c;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[fuzz-exec] comparing ",0x16);
        name.super_IString.str._M_str = in_RCX;
        name.super_IString.str._M_len = (size_t)p_Var8[1]._M_parent;
        local_68 = p_Var8;
        poVar6 = wasm::operator<<((wasm *)&std::cout,*(ostream **)(p_Var8 + 1),name);
        local_31 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_31,1);
        pmVar7 = std::
                 map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                 ::operator[](&this->results,(key_type *)__k);
        _Var1 = (pmVar7->
                super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                ).
                super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                ._M_index;
        pmVar7 = std::
                 map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                 ::operator[](&this_00->results,(key_type *)__k);
        if (_Var1 != (pmVar7->
                     super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     ).
                     super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     ._M_index) {
          return false;
        }
        other_00 = (SmallVector<wasm::Literal,_1UL> *)
                   std::
                   map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                   ::operator[](&this->results,(key_type *)__k);
        sVar3 = other_00[1].usedFixed;
        other_01 = (SmallVector<wasm::Literal,_1UL> *)
                   std::
                   map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                   ::operator[](&this_00->results,(key_type *)__k);
        if ((char)sVar3 == '\0' && (char)other_01[1].usedFixed == '\0') {
          SmallVector<wasm::Literal,_1UL>::SmallVector(&local_d8,other_00);
          SmallVector<wasm::Literal,_1UL>::SmallVector(&local_a0,other_01);
          bVar4 = areEqual(local_40,(Literals *)&local_d8,(Literals *)&local_a0);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_a0.flexible);
          wasm::Literal::~Literal(local_a0.fixed._M_elems);
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_d8.flexible);
          wasm::Literal::~Literal(local_d8.fixed._M_elems);
          if (!bVar4) {
            return false;
          }
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_68);
        other = local_48;
      } while (p_Var8 != local_58);
    }
    pLVar11 = (local_40->loggings).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar2 = (local_40->loggings).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((long)pLVar2 - (long)pLVar11 !=
        (long)(other->loggings).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(other->loggings).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      poVar6 = (ostream *)&std::cout;
      pcVar12 = "logging counts not identical!\n";
      lVar10 = 0x1e;
LAB_001cfe1c:
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar12,lVar10);
      return false;
    }
    if (pLVar2 != pLVar11) {
      local_50 = &local_108;
      uVar9 = 0;
      uVar13 = 1;
      local_48 = other;
      do {
        wasm::Literal::Literal(&local_108,pLVar11 + uVar9);
        wasm::Literal::Literal
                  (&local_f0,
                   (local_48->loggings).
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar9);
        bVar4 = areEqual(local_40,&local_108,&local_f0);
        wasm::Literal::~Literal(&local_f0);
        wasm::Literal::~Literal(&local_108);
        if (!bVar4) {
          return bVar4;
        }
        pLVar11 = (local_40->loggings).
                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar9 = ((long)(local_40->loggings).
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pLVar11 >> 3) * -0x5555555555555555
        ;
        bVar14 = uVar13 <= uVar9;
        lVar10 = uVar9 - uVar13;
        uVar9 = uVar13;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (bVar14 && lVar10 != 0);
      return bVar4;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ignoring comparison of ExecutionResults!\n",0x29);
  }
  return true;
}

Assistant:

bool operator==(ExecutionResults& other) {
    if (ignore || other.ignore) {
      std::cout << "ignoring comparison of ExecutionResults!\n";
      return true;
    }
    for (auto& [name, _] : other.results) {
      if (results.find(name) == results.end()) {
        std::cout << "[fuzz-exec] missing " << name << '\n';
        return false;
      }
      std::cout << "[fuzz-exec] comparing " << name << '\n';
      if (results[name].index() != other.results[name].index()) {
        return false;
      }
      auto* values = std::get_if<Literals>(&results[name]);
      auto* otherValues = std::get_if<Literals>(&other.results[name]);
      if (values && otherValues && !areEqual(*values, *otherValues)) {
        return false;
      }
    }
    if (loggings.size() != other.loggings.size()) {
      std::cout << "logging counts not identical!\n";
      return false;
    }
    for (Index i = 0; i < loggings.size(); i++) {
      if (!areEqual(loggings[i], other.loggings[i])) {
        return false;
      }
    }
    return true;
  }